

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O0

string * __thiscall
google::protobuf::text_format_unittest::CustomMessageFieldValuePrinter::PrintInt32_abi_cxx11_
          (string *__return_storage_ptr__,CustomMessageFieldValuePrinter *this,int32_t v)

{
  AlphaNum *in_R8;
  string local_118;
  Hex local_f0;
  AlphaNum local_e0;
  AlphaNum local_b0;
  string local_70;
  AlphaNum local_50;
  int32_t local_1c;
  CustomMessageFieldValuePrinter *pCStack_18;
  int32_t v_local;
  CustomMessageFieldValuePrinter *this_local;
  
  local_1c = v;
  pCStack_18 = this;
  this_local = (CustomMessageFieldValuePrinter *)__return_storage_ptr__;
  TextFormat::FieldValuePrinter::PrintInt32_abi_cxx11_(&local_70,&this->super_FieldValuePrinter,v);
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_50,&local_70);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_b0,"  # x");
  absl::lts_20250127::Hex::Hex<int>(&local_f0,local_1c,kNoPad,(type *)0x0);
  local_118.field_2._M_allocated_capacity = 0;
  local_118.field_2._8_8_ = 0;
  local_118._M_dataplus = (_Alloc_hider)0x0;
  local_118._1_7_ = 0;
  local_118._M_string_length = 0;
  absl::lts_20250127::strings_internal::StringifySink::StringifySink((StringifySink *)&local_118);
  absl::lts_20250127::AlphaNum::AlphaNum<absl::lts_20250127::Hex,void>
            (&local_e0,&local_f0,(StringifySink *)&local_118);
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_50,&local_b0,&local_e0,in_R8);
  absl::lts_20250127::strings_internal::StringifySink::~StringifySink((StringifySink *)&local_118);
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string PrintInt32(int32_t v) const override {
    return absl::StrCat(FieldValuePrinter::PrintInt32(v), "  # x",
                        absl::Hex(v));
  }